

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O0

void init_me_luts_bd(int *bit16lut,int range,aom_bit_depth_t bit_depth)

{
  int in_ESI;
  long in_RDI;
  double dVar1;
  double q;
  int i;
  aom_bit_depth_t in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 local_14;
  
  for (local_14 = 0; local_14 < in_ESI; local_14 = local_14 + 1) {
    dVar1 = av1_convert_qindex_to_q(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
    *(int *)(in_RDI + (long)local_14 * 4) = (int)(dVar1 * 0.0418 + 2.4107);
  }
  return;
}

Assistant:

static void init_me_luts_bd(int *bit16lut, int range,
                            aom_bit_depth_t bit_depth) {
  int i;
  // Initialize the sad lut tables using a formulaic calculation for now.
  // This is to make it easier to resolve the impact of experimental changes
  // to the quantizer tables.
  for (i = 0; i < range; i++) {
    const double q = av1_convert_qindex_to_q(i, bit_depth);
    bit16lut[i] = (int)(0.0418 * q + 2.4107);
  }
}